

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

BVSparse<Memory::JitArenaAllocator> * __thiscall
BackwardPass::GetByteCodeRegisterUpwardExposed
          (BackwardPass *this,BasicBlock *block,Func *func,JitArenaAllocator *alloc)

{
  bool bVar1;
  SymID id;
  RegSlot i;
  JitArenaAllocator *alloc_00;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  Sym *this_01;
  StackSym *this_02;
  Func *pFVar2;
  RegSlot bytecode;
  StackSym *stackSym;
  Sym *sym;
  SparseBVUnit _unit;
  BVIndex _startIndex;
  BVIndex _offset;
  BVSparseNode<Memory::JitArenaAllocator> *_curNode;
  BVIndex symID;
  TrackAllocData local_58;
  BVSparse<Memory::JitArenaAllocator> *local_30;
  BVSparse<Memory::JitArenaAllocator> *byteCodeRegisterUpwardExposed;
  JitArenaAllocator *alloc_local;
  Func *func_local;
  BasicBlock *block_local;
  BackwardPass *this_local;
  
  byteCodeRegisterUpwardExposed = (BVSparse<Memory::JitArenaAllocator> *)alloc;
  alloc_local = (JitArenaAllocator *)func;
  func_local = (Func *)block;
  block_local = (BasicBlock *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
             ,0x2317);
  alloc_00 = (JitArenaAllocator *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            alloc,&local_58);
  this_00 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,alloc_00,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse
            (this_00,(JitArenaAllocator *)byteCodeRegisterUpwardExposed);
  __startIndex = *(undefined8 **)(func_local->m_prologEncoder).currentInstrOffset;
  local_30 = this_00;
  while( true ) {
    if (__startIndex == (undefined8 *)0x0) {
      return local_30;
    }
    _unit.word._0_4_ = *(int *)(__startIndex + 1);
    sym = (Sym *)__startIndex[2];
    _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&sym);
    while (_unit.word._4_4_ != 0xffffffff) {
      id = (int)_unit.word + _unit.word._4_4_;
      BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&sym,_unit.word._4_4_);
      this_01 = SymTable::Find((SymTable *)
                               alloc_local[3].super_ArenaAllocator.
                               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                               .super_ArenaData.mallocBlocks,id);
      if ((this_01 != (Sym *)0x0) && (bVar1 = Sym::IsStackSym(this_01), bVar1)) {
        this_02 = Sym::AsStackSym(this_01);
        pFVar2 = StackSym::GetByteCodeFunc(this_02);
        if ((pFVar2 == (Func *)alloc_local) &&
           (bVar1 = StackSym::HasByteCodeRegSlot(this_02), bVar1)) {
          i = StackSym::GetByteCodeRegSlot(this_02);
          BVSparse<Memory::JitArenaAllocator>::Set(local_30,i);
        }
      }
      _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&sym);
    }
    if (__startIndex == (undefined8 *)0x0) break;
    __startIndex = (undefined8 *)*__startIndex;
  }
  return local_30;
}

Assistant:

BVSparse<JitArenaAllocator>*
BackwardPass::GetByteCodeRegisterUpwardExposed(BasicBlock* block, Func* func, JitArenaAllocator* alloc)
{
    BVSparse<JitArenaAllocator>* byteCodeRegisterUpwardExposed = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    // Convert the sym to the corresponding bytecode register
    FOREACH_BITSET_IN_SPARSEBV(symID, block->byteCodeUpwardExposedUsed)
    {
        Sym* sym = func->m_symTable->Find(symID);
        if (sym && sym->IsStackSym())
        {
            StackSym* stackSym = sym->AsStackSym();
            // Make sure we only look at bytecode from the func we're interested in
            if (stackSym->GetByteCodeFunc() == func && stackSym->HasByteCodeRegSlot())
            {
                Js::RegSlot bytecode = stackSym->GetByteCodeRegSlot();
                byteCodeRegisterUpwardExposed->Set(bytecode);
            }
        }
    }
    NEXT_BITSET_IN_SPARSEBV;

    return byteCodeRegisterUpwardExposed;
}